

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

Belief * __thiscall despot::RegDemo::InitialBelief(RegDemo *this,State *start,string *type)

{
  ParticleBelief *pPVar1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  ParticleBelief *local_60;
  Belief *belief;
  value_type local_48;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  string *type_local;
  State *start_local;
  RegDemo *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    local_48 = (value_type)(**(code **)(*(long *)this + 0xa8))(0x3fe0000000000000,this,local_3c);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38,&local_48);
  }
  pPVar1 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_78,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  despot::ParticleBelief::ParticleBelief(pPVar1,&local_78,this,0,1);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_78);
  local_60 = pPVar1;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  return (Belief *)pPVar1;
}

Assistant:

Belief* RegDemo::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	for (int i = 0; i < 2; i++)
		particles.push_back(static_cast<RegDemoState*>(Allocate(i, 0.5)));

	Belief* belief = new ParticleBelief(particles, this);
	return belief;
}